

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

void __thiscall
boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
          (unbounded_array<double,_std::allocator<double>_> *this)

{
  new_allocator<double> *in_RDI;
  double *in_stack_ffffffffffffffe8;
  
  if (*(long *)(in_RDI + 8) != 0) {
    __gnu_cxx::new_allocator<double>::deallocate(in_RDI,in_stack_ffffffffffffffe8,0x107b2c);
  }
  std::allocator<double>::~allocator((allocator<double> *)0x107b3a);
  storage_array<boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::
  ~storage_array((storage_array<boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  *)0x107b44);
  return;
}

Assistant:

BOOST_UBLAS_INLINE
        ~unbounded_array () {
            if (size_) {
                if (! detail::has_trivial_destructor<T>::value) {
                    // std::_Destroy (begin(), end(), alloc_);
                    const iterator i_end = end();
                    for (iterator i = begin (); i != i_end; ++i) {
                        iterator_destroy (i); 
                    }
                }
                alloc_.deallocate (data_, size_);
            }
        }